

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_NotifyCompletion
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *uploadCorrelationId,_Bool isSuccess,
          int responseCode,char *responseMessage)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  STRING_HANDLE handle_00;
  size_t size;
  BUFFER_HANDLE handle_01;
  uchar *source;
  char *local_98;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  BUFFER_HANDLE responseToIoTHub;
  size_t response_length;
  LOGGER_LOG l_1;
  STRING_HANDLE response;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  char *responseMessage_local;
  int responseCode_local;
  _Bool isSuccess_local;
  char *uploadCorrelationId_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle_local;
  
  if ((handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) || (uploadCorrelationId == (char *)0x0))
  {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x424,1,
                "invalid argument detected handle=%p uploadCorrelationId=%p",handle,
                uploadCorrelationId);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    pcVar3 = "false";
    if (isSuccess) {
      pcVar3 = "true";
    }
    local_98 = responseMessage;
    if (responseMessage == (char *)0x0) {
      local_98 = "";
    }
    handle_00 = STRING_construct_sprintf
                          ("{\"correlationId\":\"%s\", \"isSuccess\":%s, \"statusCode\":%d, \"statusDescription\":\"%s\"}"
                           ,uploadCorrelationId,pcVar3,(ulong)(uint)responseCode,local_98);
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x433,1,
                  "STRING_construct_sprintf failed");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else {
      size = STRING_length(handle_00);
      handle_01 = BUFFER_new();
      if (handle_01 == (BUFFER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x43d,1,"BUFFER_new failed");
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      else {
        source = (uchar *)STRING_c_str(handle_00);
        iVar1 = BUFFER_build(handle_01,source,size);
        if (iVar1 == 0) {
          iVar1 = IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion(handle,handle_01);
          if (iVar1 == 0) {
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x446,1,
                        "IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion failed");
            }
            l._4_4_ = IOTHUB_CLIENT_ERROR;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x450,1,
                      "Unable to BUFFER_build, can\'t perform IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion"
                     );
          }
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
        BUFFER_delete(handle_01);
      }
      STRING_delete(handle_00);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_NotifyCompletion(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* uploadCorrelationId, bool isSuccess, int responseCode, const char* responseMessage)
{
    IOTHUB_CLIENT_RESULT result;

    if (handle == NULL || uploadCorrelationId == NULL)
    {
        LogError("invalid argument detected handle=%p uploadCorrelationId=%p", handle, uploadCorrelationId);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        STRING_HANDLE response = STRING_construct_sprintf(RESPONSE_BODY_FORMAT,
                                                    uploadCorrelationId,
                                                    isSuccess ? RESPONSE_BODY_SUCCESS_BOOLEAN_STRING : RESPONSE_BODY_ERROR_BOOLEAN_STRING,
                                                    responseCode,
                                                    responseMessage != NULL ? responseMessage : EMPTY_STRING);

        if(response == NULL)
        {
            LogError("STRING_construct_sprintf failed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            size_t response_length = STRING_length(response);
            BUFFER_HANDLE responseToIoTHub = BUFFER_new();

            if (responseToIoTHub == NULL)
            {
                LogError("BUFFER_new failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                if (BUFFER_build(responseToIoTHub, (const unsigned char*)STRING_c_str(response), response_length) == 0)
                {
                    if (IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion(upload_data, responseToIoTHub) != 0)
                    {
                        LogError("IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion failed");
                        result = IOTHUB_CLIENT_ERROR;
                    }
                    else
                    {
                        result = IOTHUB_CLIENT_OK;
                    }
                }
                else
                {
                    LogError("Unable to BUFFER_build, can't perform IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion");
                    result = IOTHUB_CLIENT_ERROR;
                }

                BUFFER_delete(responseToIoTHub);
            }

            STRING_delete(response);
        }
    }

    return result;
}